

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall cmExtraEclipseCDT4Generator::CreateProjectFile(cmExtraEclipseCDT4Generator *this)

{
  cmLocalGenerator *this_00;
  byte bVar1;
  bool bVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_01;
  const_reference ppcVar3;
  cmMakefile *this_02;
  string *psVar4;
  ulong uVar5;
  cmState *this_03;
  char *pcVar6;
  string local_bb0;
  undefined1 local_b90 [8];
  string linkSourceDirectory;
  undefined1 local_b68 [8];
  string sourceLinkedResourceName;
  string local_b40;
  allocator<char> local_b19;
  string local_b18;
  reference local_af8;
  string *n_1;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_ad0;
  undefined1 local_ab0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraNatures;
  string local_a90;
  char *local_a70;
  char *extraNaturesProp;
  string local_a60;
  reference local_a40;
  string *n;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  allocator<char> local_979;
  string local_978;
  allocator<char> local_951;
  string local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  undefined1 local_910 [8];
  ostringstream errorOutputParser;
  string local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  undefined1 local_758 [8];
  ostringstream environment;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  string local_570;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  string local_438;
  allocator<char> local_411;
  string local_410;
  string local_3f0;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  undefined1 local_360 [8];
  cmXMLWriter xml;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  undefined1 local_2b8 [8];
  string compilerId;
  undefined1 local_288 [8];
  cmGeneratedFileStream fout;
  string filename;
  cmMakefile *mf;
  cmLocalGenerator *lg;
  cmExtraEclipseCDT4Generator *this_local;
  
  this_01 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_01,0);
  this_00 = *ppcVar3;
  this_02 = cmLocalGenerator::GetMakefile(this_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fout.field_0x240,&this->HomeOutputDirectory,"/.project");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_288,(string *)&fout.field_0x240,false,None);
  bVar1 = std::ios::operator!((ios *)(local_288 + (long)*(_func_int **)((long)local_288 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"CMAKE_C_COMPILER_ID",&local_2d9);
    psVar4 = cmMakefile::GetSafeDefinition(this_02,&local_2d8);
    std::__cxx11::string::string((string *)local_2b8,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"CMAKE_CXX_COMPILER_ID",(allocator<char> *)&xml.field_0x57);
      psVar4 = cmMakefile::GetSafeDefinition(this_02,&local_300);
      std::__cxx11::string::operator=((string *)local_2b8,(string *)psVar4);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator((allocator<char> *)&xml.field_0x57);
    }
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_360,(ostream *)local_288,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_360,"UTF-8");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"projectDescription",&local_381);
    cmXMLWriter::StartElement((cmXMLWriter *)local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator(&local_381);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"name",&local_3a9);
    cmLocalGenerator::GetProjectName_abi_cxx11_(&local_3f0,this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"CMAKE_BUILD_TYPE",&local_411);
    psVar4 = cmMakefile::GetSafeDefinition(this_02,&local_410);
    GetPathBasename(&local_438,&this->HomeOutputDirectory);
    GenerateProjectName(&local_3d0,&local_3f0,psVar4,&local_438);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_360,&local_3a8,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"comment",&local_459);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_360,&local_458,(char (*) [1])0x96a110);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator(&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"projects",&local_481);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_360,&local_480,(char (*) [1])0x96a110);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"buildSpec",&local_4a9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_360,&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,"buildCommand",&local_4d1);
    cmXMLWriter::StartElement((cmXMLWriter *)local_360,&local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"name",&local_4f9);
    cmXMLWriter::Element<char[38]>
              ((cmXMLWriter *)local_360,&local_4f8,
               (char (*) [38])"org.eclipse.cdt.make.core.makeBuilder");
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator(&local_4f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"triggers",&local_521);
    cmXMLWriter::Element<char[24]>
              ((cmXMLWriter *)local_360,&local_520,(char (*) [24])"clean,full,incremental,");
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator(&local_521);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"arguments",&local_549);
    cmXMLWriter::StartElement((cmXMLWriter *)local_360,&local_548);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator(&local_549);
    AppendDictionary<char[6]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.cleanBuildTarget",
               (char (*) [6])0x954860);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.enableCleanBuild",
               (char (*) [5])0x98a1e1);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.append_environment",
               (char (*) [5])0x98a1e1);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.stopOnError",
               (char (*) [5])0x98a1e1);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.enabledIncrementalBuild",
               (char (*) [5])0x98a1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_590,"CMAKE_MAKE_PROGRAM",&local_591);
    psVar4 = cmMakefile::GetRequiredDefinition(this_02,&local_590);
    GetEclipsePath(&local_570,psVar4);
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.build.command",&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator(&local_591);
    AppendDictionary<char[47]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.contents",
               (char (*) [47])"org.eclipse.cdt.make.core.activeConfigSettings");
    AppendDictionary<char[4]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.build.target.inc",
               (char (*) [4])0x91c662);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5b8,"CMAKE_ECLIPSE_MAKE_ARGUMENTS",&local_5b9);
    psVar4 = cmMakefile::GetSafeDefinition(this_02,&local_5b8);
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.build.arguments",psVar4);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::allocator<char>::~allocator(&local_5b9);
    GetEclipsePath(&local_5e0,&this->HomeOutputDirectory);
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.buildLocation",&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    AppendDictionary<char[6]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.useDefaultBuildCmd",
               (char (*) [6])0x95d324);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_758);
    std::operator<<((ostream *)local_758,"VERBOSE=1|CMAKE_NO_VERBOSE=1|");
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2b8,"MSVC");
    if (bVar2) {
      AddEnvVar((ostream *)local_758,"PATH",this_00);
      AddEnvVar((ostream *)local_758,"INCLUDE",this_00);
      AddEnvVar((ostream *)local_758,"LIB",this_00);
      AddEnvVar((ostream *)local_758,"LIBPATH",this_00);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2b8,"Intel");
      if (bVar2) {
        AddEnvVar((ostream *)local_758,"INTEL_LICENSE_FILE",this_00);
      }
    }
    std::__cxx11::ostringstream::str();
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.environment",&local_778);
    std::__cxx11::string::~string((string *)&local_778);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.enableFullBuild",
               (char (*) [5])0x98a1e1);
    AppendDictionary<char[4]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.build.target.auto",
               (char (*) [4])0x91c662);
    AppendDictionary<char[6]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.enableAutoBuild",
               (char (*) [6])0x95d324);
    AppendDictionary<char[6]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.build.target.clean",
               (char (*) [6])0x954860);
    AppendDictionary<char[4]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.fullBuildTarget",
               (char (*) [4])0x91c662);
    AppendDictionary<char[1]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.buildArguments",
               (char (*) [1])0x96a110);
    GetEclipsePath(&local_798,&this->HomeOutputDirectory);
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.build.location",&local_798);
    std::__cxx11::string::~string((string *)&local_798);
    AppendDictionary<char[4]>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.make.core.autoBuildTarget",
               (char (*) [4])0x91c662);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_910);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2b8,"MSVC");
    if (bVar2) {
      std::operator<<((ostream *)local_910,"org.eclipse.cdt.core.VCErrorParser;");
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2b8,"Intel");
      if (bVar2) {
        std::operator<<((ostream *)local_910,"org.eclipse.cdt.core.ICCErrorParser;");
      }
    }
    if ((this->SupportsGmakeErrorParser & 1U) == 0) {
      std::operator<<((ostream *)local_910,"org.eclipse.cdt.core.MakeErrorParser;");
    }
    else {
      std::operator<<((ostream *)local_910,"org.eclipse.cdt.core.GmakeErrorParser;");
    }
    std::operator<<((ostream *)local_910,
                    "org.eclipse.cdt.core.GCCErrorParser;org.eclipse.cdt.core.GASErrorParser;org.eclipse.cdt.core.GLDErrorParser;"
                   );
    std::__cxx11::ostringstream::str();
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_360,"org.eclipse.cdt.core.errorOutputParser",&local_930);
    std::__cxx11::string::~string((string *)&local_930);
    cmXMLWriter::EndElement((cmXMLWriter *)local_360);
    cmXMLWriter::EndElement((cmXMLWriter *)local_360);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_950,"buildCommand",&local_951);
    cmXMLWriter::StartElement((cmXMLWriter *)local_360,&local_950);
    std::__cxx11::string::~string((string *)&local_950);
    std::allocator<char>::~allocator(&local_951);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_978,"name",&local_979);
    cmXMLWriter::Element<char[47]>
              ((cmXMLWriter *)local_360,&local_978,
               (char (*) [47])"org.eclipse.cdt.make.core.ScannerConfigBuilder");
    std::__cxx11::string::~string((string *)&local_978);
    std::allocator<char>::~allocator(&local_979);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a0,"arguments",&local_9a1);
    cmXMLWriter::StartElement((cmXMLWriter *)local_360,&local_9a0);
    std::__cxx11::string::~string((string *)&local_9a0);
    std::allocator<char>::~allocator(&local_9a1);
    cmXMLWriter::EndElement((cmXMLWriter *)local_360);
    cmXMLWriter::EndElement((cmXMLWriter *)local_360);
    cmXMLWriter::EndElement((cmXMLWriter *)local_360);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c8,"natures",&local_9c9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_360,&local_9c8);
    std::__cxx11::string::~string((string *)&local_9c8);
    std::allocator<char>::~allocator(&local_9c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f0,"nature",&local_9f1);
    cmXMLWriter::Element<char[37]>
              ((cmXMLWriter *)local_360,&local_9f0,
               (char (*) [37])"org.eclipse.cdt.make.core.makeNature");
    std::__cxx11::string::~string((string *)&local_9f0);
    std::allocator<char>::~allocator(&local_9f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a18,"nature",(allocator<char> *)((long)&__range1 + 7));
    cmXMLWriter::Element<char[46]>
              ((cmXMLWriter *)local_360,&local_a18,
               (char (*) [46])"org.eclipse.cdt.make.core.ScannerConfigNature");
    std::__cxx11::string::~string((string *)&local_a18);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    __end1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->Natures);
    n = (string *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->Natures);
    while (bVar2 = std::operator!=(&__end1,(_Self *)&n), bVar2) {
      local_a40 = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a60,"nature",(allocator<char> *)((long)&extraNaturesProp + 7));
      cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_360,&local_a60,local_a40);
      std::__cxx11::string::~string((string *)&local_a60);
      std::allocator<char>::~allocator((allocator<char> *)((long)&extraNaturesProp + 7));
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    this_03 = cmMakefile::GetState(this_02);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a90,"ECLIPSE_EXTRA_NATURES",
               (allocator<char> *)
               ((long)&extraNatures.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar6 = cmState::GetGlobalProperty(this_03,&local_a90);
    std::__cxx11::string::~string((string *)&local_a90);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&extraNatures.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_a70 = pcVar6;
    if (pcVar6 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_ab0);
      pcVar6 = local_a70;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ad0,pcVar6,(allocator<char> *)((long)&__range2 + 7));
      cmSystemTools::ExpandListArgument
                (&local_ad0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_ab0,false);
      std::__cxx11::string::~string((string *)&local_ad0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_ab0);
      n_1 = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_ab0);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&n_1), bVar2) {
        local_af8 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b18,"nature",&local_b19)
        ;
        cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_360,&local_b18,local_af8);
        std::__cxx11::string::~string((string *)&local_b18);
        std::allocator<char>::~allocator(&local_b19);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_ab0);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_360);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b40,"linkedResources",
               (allocator<char> *)(sourceLinkedResourceName.field_2._M_local_buf + 0xf));
    cmXMLWriter::StartElement((cmXMLWriter *)local_360,&local_b40);
    std::__cxx11::string::~string((string *)&local_b40);
    std::allocator<char>::~allocator
              ((allocator<char> *)(sourceLinkedResourceName.field_2._M_local_buf + 0xf));
    if ((this->IsOutOfSourceBuild & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b68,"[Source directory]",
                 (allocator<char> *)(linkSourceDirectory.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(linkSourceDirectory.field_2._M_local_buf + 0xf));
      psVar4 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(this_00);
      GetEclipsePath((string *)local_b90,psVar4);
      bVar2 = cmsys::SystemTools::IsSubDirectory(&this->HomeOutputDirectory,(string *)local_b90);
      if (!bVar2) {
        GetEclipsePath(&local_bb0,(string *)local_b90);
        AppendLinkedResource((cmXMLWriter *)local_360,(string *)local_b68,&local_bb0,LinkToFolder);
        std::__cxx11::string::~string((string *)&local_bb0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->SrcLinkedResources,(value_type *)local_b68);
      }
      std::__cxx11::string::~string((string *)local_b90);
      std::__cxx11::string::~string((string *)local_b68);
    }
    if ((this->SupportsVirtualFolders & 1U) != 0) {
      CreateLinksToSubprojects(this,(cmXMLWriter *)local_360,&this->HomeOutputDirectory);
      CreateLinksForTargets(this,(cmXMLWriter *)local_360);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_360);
    cmXMLWriter::EndElement((cmXMLWriter *)local_360);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_910);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_758);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_360);
    std::__cxx11::string::~string((string *)local_2b8);
    compilerId.field_2._8_4_ = 0;
  }
  else {
    compilerId.field_2._8_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_288);
  std::__cxx11::string::~string((string *)&fout.field_0x240);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateProjectFile()
{
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  cmMakefile* mf = lg->GetMakefile();

  const std::string filename = this->HomeOutputDirectory + "/.project";

  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  std::string compilerId = mf->GetSafeDefinition("CMAKE_C_COMPILER_ID");
  if (compilerId.empty()) // no C compiler, try the C++ compiler:
  {
    compilerId = mf->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
  }

  cmXMLWriter xml(fout);

  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");

  xml.Element("name",
              cmExtraEclipseCDT4Generator::GenerateProjectName(
                lg->GetProjectName(),
                mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
                cmExtraEclipseCDT4Generator::GetPathBasename(
                  this->HomeOutputDirectory)));

  xml.Element("comment", "");
  xml.Element("projects", "");

  xml.StartElement("buildSpec");
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.makeBuilder");
  xml.Element("triggers", "clean,full,incremental,");
  xml.StartElement("arguments");

  // use clean target
  AppendDictionary(xml, "org.eclipse.cdt.make.core.cleanBuildTarget", "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableCleanBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.append_environment",
                   "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.stopOnError", "true");

  // set the make command
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enabledIncrementalBuild",
                   "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.command",
                   cmExtraEclipseCDT4Generator::GetEclipsePath(
                     mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM")));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.contents",
                   "org.eclipse.cdt.make.core.activeConfigSettings");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.inc", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.arguments",
                   mf->GetSafeDefinition("CMAKE_ECLIPSE_MAKE_ARGUMENTS"));
  AppendDictionary(
    xml, "org.eclipse.cdt.make.core.buildLocation",
    cmExtraEclipseCDT4Generator::GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.useDefaultBuildCmd",
                   "false");

  // set project specific environment
  std::ostringstream environment;
  environment << "VERBOSE=1|CMAKE_NO_VERBOSE=1|"; // verbose Makefile output
  // set vsvars32.bat environment available at CMake time,
  //   but not necessarily when eclipse is open
  if (compilerId == "MSVC") {
    AddEnvVar(environment, "PATH", lg);
    AddEnvVar(environment, "INCLUDE", lg);
    AddEnvVar(environment, "LIB", lg);
    AddEnvVar(environment, "LIBPATH", lg);
  } else if (compilerId == "Intel") {
    // if the env.var is set, use this one and put it in the cache
    // if the env.var is not set, but the value is in the cache,
    // use it from the cache:
    AddEnvVar(environment, "INTEL_LICENSE_FILE", lg);
  }
  AppendDictionary(xml, "org.eclipse.cdt.make.core.environment",
                   environment.str());

  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableFullBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.auto", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableAutoBuild", "false");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.clean",
                   "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.fullBuildTarget", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.buildArguments", "");
  AppendDictionary(
    xml, "org.eclipse.cdt.make.core.build.location",
    cmExtraEclipseCDT4Generator::GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.autoBuildTarget", "all");

  // set error parsers
  std::ostringstream errorOutputParser;

  if (compilerId == "MSVC") {
    errorOutputParser << "org.eclipse.cdt.core.VCErrorParser;";
  } else if (compilerId == "Intel") {
    errorOutputParser << "org.eclipse.cdt.core.ICCErrorParser;";
  }

  if (this->SupportsGmakeErrorParser) {
    errorOutputParser << "org.eclipse.cdt.core.GmakeErrorParser;";
  } else {
    errorOutputParser << "org.eclipse.cdt.core.MakeErrorParser;";
  }

  errorOutputParser << "org.eclipse.cdt.core.GCCErrorParser;"
                       "org.eclipse.cdt.core.GASErrorParser;"
                       "org.eclipse.cdt.core.GLDErrorParser;";
  AppendDictionary(xml, "org.eclipse.cdt.core.errorOutputParser",
                   errorOutputParser.str());

  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.ScannerConfigBuilder");
  xml.StartElement("arguments");
  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.EndElement(); // buildSpec

  // set natures for c/c++ projects
  xml.StartElement("natures");
  xml.Element("nature", "org.eclipse.cdt.make.core.makeNature");
  xml.Element("nature", "org.eclipse.cdt.make.core.ScannerConfigNature");

  for (std::string const& n : this->Natures) {
    xml.Element("nature", n);
  }

  if (const char* extraNaturesProp =
        mf->GetState()->GetGlobalProperty("ECLIPSE_EXTRA_NATURES")) {
    std::vector<std::string> extraNatures;
    cmSystemTools::ExpandListArgument(extraNaturesProp, extraNatures);
    for (std::string const& n : extraNatures) {
      xml.Element("nature", n);
    }
  }

  xml.EndElement(); // natures

  xml.StartElement("linkedResources");
  // create linked resources
  if (this->IsOutOfSourceBuild) {
    // create a linked resource to CMAKE_SOURCE_DIR
    // (this is not done anymore for each project because of
    // https://gitlab.kitware.com/cmake/cmake/issues/9978 and because I found
    // it actually quite confusing in bigger projects with many directories and
    // projects, Alex

    std::string sourceLinkedResourceName = "[Source directory]";
    std::string linkSourceDirectory =
      cmExtraEclipseCDT4Generator::GetEclipsePath(
        lg->GetCurrentSourceDirectory());
    // .project dir can't be subdir of a linked resource dir
    if (!cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                       linkSourceDirectory)) {
      cmExtraEclipseCDT4Generator::AppendLinkedResource(
        xml, sourceLinkedResourceName,
        cmExtraEclipseCDT4Generator::GetEclipsePath(linkSourceDirectory),
        LinkToFolder);
      this->SrcLinkedResources.push_back(std::move(sourceLinkedResourceName));
    }
  }

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeOutputDirectory);

    this->CreateLinksForTargets(xml);
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
}